

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.cpp
# Opt level: O0

void duckdb::StringColumnReader::ReferenceBlock
               (Vector *result,shared_ptr<duckdb::ResizeableBuffer,_true> *block)

{
  Vector *in_RSI;
  shared_ptr<duckdb::VectorBuffer,_true> *in_RDI;
  shared_ptr<duckdb::ParquetStringVectorBuffer,_true> *ref;
  shared_ptr<duckdb::ParquetStringVectorBuffer,_true> local_30;
  buffer_ptr<VectorBuffer> *in_stack_ffffffffffffffe8;
  
  ref = &local_30;
  make_buffer<duckdb::ParquetStringVectorBuffer,duckdb::shared_ptr<duckdb::ResizeableBuffer,true>&>
            ((shared_ptr<duckdb::ResizeableBuffer,_true> *)ref);
  shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr<duckdb::ParquetStringVectorBuffer,_0>
            (in_RDI,ref);
  StringVector::AddBuffer(in_RSI,in_stack_ffffffffffffffe8);
  shared_ptr<duckdb::VectorBuffer,_true>::~shared_ptr
            ((shared_ptr<duckdb::VectorBuffer,_true> *)0x227f0d9);
  shared_ptr<duckdb::ParquetStringVectorBuffer,_true>::~shared_ptr
            ((shared_ptr<duckdb::ParquetStringVectorBuffer,_true> *)0x227f0e3);
  return;
}

Assistant:

void StringColumnReader::ReferenceBlock(Vector &result, shared_ptr<ResizeableBuffer> &block) {
	StringVector::AddBuffer(result, make_buffer<ParquetStringVectorBuffer>(block));
}